

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

void __thiscall SslTcpSocketImpl::~SslTcpSocketImpl(SslTcpSocketImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Manager_type p_Var3;
  int iVar4;
  
  (this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl =
       (_func_int **)&PTR__SslTcpSocketImpl_00146dd0;
  if (this->m_iSslInit == 1) {
    iVar4 = OpenSSLWrapper::SslConnection::GetShutDownFlag
                      ((this->m_pSslCon)._M_t.
                       super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl);
    if (iVar4 < 1) {
      OpenSSLWrapper::SslConnection::SSLSetShutdown
                ((this->m_pSslCon)._M_t.
                 super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl,3);
    }
  }
  pcVar2 = (this->m_strTrustRootCert)._M_dataplus._M_p;
  paVar1 = &(this->m_strTrustRootCert).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_vProtoList);
  p_Var3 = (this->m_fClientConnectedParam).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->m_fClientConnectedParam,
              (_Any_data *)&this->m_fClientConnectedParam,__destroy_functor);
  }
  p_Var3 = (this->m_fClientConnected).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->m_fClientConnected,(_Any_data *)&this->m_fClientConnected,
              __destroy_functor);
  }
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr(&this->m_pSslCon);
  std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
  ~vector(&this->m_pServerCtx);
  OpenSSLWrapper::SslContext::~SslContext(&(this->m_pClientCtx).super_SslContext);
  TcpSocketImpl::~TcpSocketImpl(&this->super_TcpSocketImpl);
  return;
}

Assistant:

SslTcpSocketImpl::~SslTcpSocketImpl()
{
    if (m_iSslInit == 1 && m_pSslCon->GetShutDownFlag() < 1)
        m_pSslCon->SSLSetShutdown(SSL_SENT_SHUTDOWN | SSL_RECEIVED_SHUTDOWN);
}